

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

int saslclientio_receive_byte(SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance,uchar b)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  uchar b_local;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance_local;
  
  l._7_1_ = b;
  _result = sasl_client_io_instance;
  if (sasl_client_io_instance->sasl_header_exchange_state - SASL_HEADER_EXCHANGE_IDLE < 2) {
    if (b == "AMQP\x03\x01"[sasl_client_io_instance->header_bytes_received]) {
      sasl_client_io_instance->header_bytes_received =
           sasl_client_io_instance->header_bytes_received + 1;
      if (sasl_client_io_instance->header_bytes_received == 8) {
        if (((sasl_client_io_instance->field_0x78 & 1) != 0) &&
           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_TRACE,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                    ,"saslclientio_receive_byte",0x192,1,"<- Header (AMQP 3.1.0.0)");
        }
        if (_result->sasl_header_exchange_state == SASL_HEADER_EXCHANGE_IDLE) {
          _result->sasl_header_exchange_state = SASL_HEADER_EXCHANGE_HEADER_RCVD;
          iVar1 = send_sasl_header(_result);
          if (iVar1 == 0) {
            l._0_4_ = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                        ,"saslclientio_receive_byte",0x1a7,1,"Could not send SASL header");
            }
            l._0_4_ = 0x1a8;
          }
        }
        else if (_result->sasl_header_exchange_state == SASL_HEADER_EXCHANGE_HEADER_SENT) {
          _result->sasl_header_exchange_state = SASL_HEADER_EXCHANGE_HEADER_EXCH;
          l._0_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar3 = SASL_HEADER_EXCHANGE_STATEStrings(_result->sasl_header_exchange_state);
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                      ,"saslclientio_receive_byte",0x198,1,
                      "Invalid SASL header exchange state: %s%s (%d)","",pcVar3,
                      _result->sasl_header_exchange_state);
          }
          l._0_4_ = 0x199;
        }
      }
      else {
        l._0_4_ = 0;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                  ,"saslclientio_receive_byte",0x188,1,"Mismatched SASL header");
      }
      l._0_4_ = 0x189;
    }
  }
  else if (sasl_client_io_instance->sasl_header_exchange_state == SASL_HEADER_EXCHANGE_HEADER_EXCH)
  {
    if (sasl_client_io_instance->sasl_client_negotiation_state ==
        SASL_CLIENT_NEGOTIATION_OUTCOME_RCVD) {
      (*sasl_client_io_instance->on_bytes_received)
                (sasl_client_io_instance->on_bytes_received_context,(uchar *)((long)&l + 7),1);
      l._0_4_ = 0;
    }
    else if (sasl_client_io_instance->sasl_client_negotiation_state == SASL_CLIENT_NEGOTIATION_ERROR
            ) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = SASL_CLIENT_NEGOTIATION_STATEStrings(SASL_CLIENT_NEGOTIATION_ERROR);
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                  ,"saslclientio_receive_byte",0x169,1,
                  "Byte being received in unexpected state: %s%s (%d)","",pcVar3,7);
      }
      l._0_4_ = 0x16a;
    }
    else {
      iVar1 = frame_codec_receive_bytes
                        (sasl_client_io_instance->frame_codec,(uchar *)((long)&l + 7),1);
      if (iVar1 == 0) {
        l._0_4_ = 0;
      }
      else {
        l._0_4_ = 0x172;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = SASL_HEADER_EXCHANGE_STATEStrings(_result->sasl_header_exchange_state);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                ,"saslclientio_receive_byte",0x161,1,
                "Byte being received in unexpected state: %s%s (%d)","",pcVar3,
                _result->sasl_header_exchange_state);
    }
    l._0_4_ = 0x162;
  }
  return (int)l;
}

Assistant:

static int saslclientio_receive_byte(SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance, unsigned char b)
{
    int result;

    switch (sasl_client_io_instance->sasl_header_exchange_state)
    {
    default:
        LogError("Byte being received in unexpected state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_HEADER_EXCHANGE_STATE, sasl_client_io_instance->sasl_header_exchange_state));
        result = MU_FAILURE;
        break;

    case SASL_HEADER_EXCHANGE_HEADER_EXCH:
        switch (sasl_client_io_instance->sasl_client_negotiation_state)
        {
        case SASL_CLIENT_NEGOTIATION_ERROR:
            LogError("Byte being received in unexpected state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, SASL_CLIENT_NEGOTIATION_ERROR));
            result = MU_FAILURE;
            break;

        default:
            /* Codes_SRS_SASLCLIENTIO_01_068: [During the SASL frame exchange that constitutes the handshake the received bytes from the underlying IO shall be fed to the frame codec instance created in `saslclientio_create` by calling `frame_codec_receive_bytes`.]*/
            if (frame_codec_receive_bytes(sasl_client_io_instance->frame_codec, &b, 1) != 0)
            {
                /* Codes_SRS_SASLCLIENTIO_01_088: [If `frame_codec_receive_bytes` fails, the `on_io_error` callback shall be triggered.]*/
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            break;

        case SASL_CLIENT_NEGOTIATION_OUTCOME_RCVD:
            sasl_client_io_instance->on_bytes_received(sasl_client_io_instance->on_bytes_received_context, &b, 1);
            result = 0;
            break;
        }

        break;

    /* Codes_SRS_SASLCLIENTIO_01_003: [Other than using a protocol id of three, the exchange of SASL layer headers follows the same rules specified in the version negotiation section of the transport specification (See Part 2: section 2.2).] */
    case SASL_HEADER_EXCHANGE_IDLE:
    case SASL_HEADER_EXCHANGE_HEADER_SENT:
        if (b != sasl_header[sasl_client_io_instance->header_bytes_received])
        {
            LogError("Mismatched SASL header");
            result = MU_FAILURE;
        }
        else
        {
            sasl_client_io_instance->header_bytes_received++;
            if (sasl_client_io_instance->header_bytes_received == sizeof(sasl_header))
            {
                if (sasl_client_io_instance->is_trace_on != 0)
                {
                    LOG(AZ_LOG_TRACE, LOG_LINE, "<- Header (AMQP 3.1.0.0)");
                }

                switch (sasl_client_io_instance->sasl_header_exchange_state)
                {
                default:
                    LogError("Invalid SASL header exchange state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_HEADER_EXCHANGE_STATE, sasl_client_io_instance->sasl_header_exchange_state));
                    result = MU_FAILURE;
                    break;

                case SASL_HEADER_EXCHANGE_HEADER_SENT:
                    /* from this point on we need to decode SASL frames */
                    sasl_client_io_instance->sasl_header_exchange_state = SASL_HEADER_EXCHANGE_HEADER_EXCH;
                    result = 0;
                    break;

                case SASL_HEADER_EXCHANGE_IDLE:
                    sasl_client_io_instance->sasl_header_exchange_state = SASL_HEADER_EXCHANGE_HEADER_RCVD;
                    if (send_sasl_header(sasl_client_io_instance) != 0)
                    {
                        /* Codes_SRS_SASLCLIENTIO_01_077: [If sending the SASL header fails, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                        LogError("Could not send SASL header");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }

                    break;
                }
            }
            else
            {
                result = 0;
            }
        }

        break;
    }

    return result;
}